

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O0

void Assimp::FBX::anon_unknown_3::ReadData
               (char **sbegin_out,char **send_out,char *input,char **cursor,char *end)

{
  char *pcVar1;
  size_t sVar2;
  allocator local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  char *local_e0;
  char *se;
  char *sb;
  string local_c8;
  allocator local_a1;
  string local_a0;
  int local_7c;
  uint32_t local_78;
  uint32_t stride;
  uint32_t comp_len;
  uint32_t encoding;
  uint32_t length_1;
  uint32_t length;
  char type;
  allocator local_51;
  string local_50;
  char *local_30;
  char *end_local;
  char **cursor_local;
  char *input_local;
  char **send_out_local;
  char **sbegin_out_local;
  
  local_30 = end;
  end_local = (char *)cursor;
  cursor_local = (char **)input;
  input_local = (char *)send_out;
  send_out_local = sbegin_out;
  sVar2 = Offset(*cursor,end);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_50,"cannot ReadData, out of bounds reading length",&local_51);
    TokenizeError(&local_50,(char *)cursor_local,*(char **)end_local);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  length_1._3_1_ = **(undefined1 **)end_local;
  pcVar1 = *(char **)end_local;
  *(char **)end_local = pcVar1 + 1;
  *send_out_local = pcVar1;
  switch(length_1._3_1_) {
  case 0x43:
    *(long *)end_local = *(long *)end_local + 1;
    break;
  case 0x44:
    *(long *)end_local = *(long *)end_local + 8;
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,(char *)((long)&length_1 + 3),1,&local_121);
    std::operator+(&local_100,"cannot ReadData, unexpected type code: ",&local_120);
    TokenizeError(&local_100,(char *)cursor_local,*(char **)end_local);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    break;
  case 0x46:
  case 0x49:
    *(long *)end_local = *(long *)end_local + 4;
    break;
  case 0x4c:
    *(long *)end_local = *(long *)end_local + 8;
    break;
  case 0x52:
    encoding = ReadWord((char *)cursor_local,(char **)end_local,local_30);
    *(ulong *)end_local = *(long *)end_local + (ulong)encoding;
    break;
  case 0x53:
    ReadString(&se,&local_e0,(char *)cursor_local,(char **)end_local,local_30,true,true);
    break;
  case 0x59:
    *(long *)end_local = *(long *)end_local + 2;
    break;
  case 0x62:
    *(char **)end_local = local_30;
    break;
  case 99:
  case 100:
  case 0x66:
  case 0x69:
  case 0x6c:
    comp_len = ReadWord((char *)cursor_local,(char **)end_local,local_30);
    stride = ReadWord((char *)cursor_local,(char **)end_local,local_30);
    local_78 = ReadWord((char *)cursor_local,(char **)end_local,local_30);
    if (stride == 0) {
      local_7c = 0;
      switch(length_1._3_1_) {
      case 99:
        local_7c = 1;
        break;
      case 100:
      case 0x6c:
        local_7c = 8;
        break;
      default:
        break;
      case 0x66:
      case 0x69:
        local_7c = 4;
      }
      if (comp_len * local_7c != local_78) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_a0,
                   "cannot ReadData, calculated data stride differs from what the file claims",
                   &local_a1);
        TokenizeError(&local_a0,(char *)cursor_local,*(char **)end_local);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      }
    }
    else if (stride != 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c8,"cannot ReadData, unknown encoding",
                 (allocator *)((long)&sb + 7));
      TokenizeError(&local_c8,(char *)cursor_local,*(char **)end_local);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&sb + 7));
    }
    *(ulong *)end_local = *(long *)end_local + (ulong)local_78;
  }
  if (local_30 < *(char **)end_local) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,(char *)((long)&length_1 + 3),1,&local_169);
    std::operator+(&local_148,"cannot ReadData, the remaining size is too small for the data type: "
                   ,&local_168);
    TokenizeError(&local_148,(char *)cursor_local,*(char **)end_local);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  *(undefined8 *)input_local = *(undefined8 *)end_local;
  return;
}

Assistant:

void ReadData(const char*& sbegin_out, const char*& send_out, const char* input, const char*& cursor, const char* end) {
    if(Offset(cursor, end) < 1) {
        TokenizeError("cannot ReadData, out of bounds reading length",input, cursor);
    }

    const char type = *cursor;
    sbegin_out = cursor++;

    switch(type)
    {
        // 16 bit int
    case 'Y':
        cursor += 2;
        break;

        // 1 bit bool flag (yes/no)
    case 'C':
        cursor += 1;
        break;

        // 32 bit int
    case 'I':
        // <- fall through

        // float
    case 'F':
        cursor += 4;
        break;

        // double
    case 'D':
        cursor += 8;
        break;

        // 64 bit int
    case 'L':
        cursor += 8;
        break;

        // note: do not write cursor += ReadWord(...cursor) as this would be UB

        // raw binary data
    case 'R':
    {
        const uint32_t length = ReadWord(input, cursor, end);
        cursor += length;
        break;
    }

    case 'b':
        // TODO: what is the 'b' type code? Right now we just skip over it /
        // take the full range we could get
        cursor = end;
        break;

        // array of *
    case 'f':
    case 'd':
    case 'l':
    case 'i':
    case 'c':   {
        const uint32_t length = ReadWord(input, cursor, end);
        const uint32_t encoding = ReadWord(input, cursor, end);

        const uint32_t comp_len = ReadWord(input, cursor, end);

        // compute length based on type and check against the stored value
        if(encoding == 0) {
            uint32_t stride = 0;
            switch(type)
            {
            case 'f':
            case 'i':
                stride = 4;
                break;

            case 'd':
            case 'l':
                stride = 8;
                break;

            case 'c':
                stride = 1;
                break;

            default:
                ai_assert(false);
            };
            ai_assert(stride > 0);
            if(length * stride != comp_len) {
                TokenizeError("cannot ReadData, calculated data stride differs from what the file claims",input, cursor);
            }
        }
        // zip/deflate algorithm (encoding==1)? take given length. anything else? die
        else if (encoding != 1) {
            TokenizeError("cannot ReadData, unknown encoding",input, cursor);
        }
        cursor += comp_len;
        break;
    }

        // string
    case 'S': {
        const char* sb, *se;
        // 0 characters can legally happen in such strings
        ReadString(sb, se, input, cursor, end, true, true);
        break;
    }
    default:
        TokenizeError("cannot ReadData, unexpected type code: " + std::string(&type, 1),input, cursor);
    }

    if(cursor > end) {
        TokenizeError("cannot ReadData, the remaining size is too small for the data type: " + std::string(&type, 1),input, cursor);
    }

    // the type code is contained in the returned range
    send_out = cursor;
}